

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void * ossl_get_internals(ssl_connect_data *connssl,CURLINFO info)

{
  void *local_28;
  ossl_ssl_backend_data *backend;
  CURLINFO info_local;
  ssl_connect_data *connssl_local;
  
  if (info == CURLINFO_TLS_SESSION) {
    local_28 = *connssl->backend;
  }
  else {
    local_28 = *(void **)((long)connssl->backend + 8);
  }
  return local_28;
}

Assistant:

static void *ossl_get_internals(struct ssl_connect_data *connssl,
                                CURLINFO info)
{
  /* Legacy: CURLINFO_TLS_SESSION must return an SSL_CTX pointer. */
  struct ossl_ssl_backend_data *backend =
    (struct ossl_ssl_backend_data *)connssl->backend;
  DEBUGASSERT(backend);
  return info == CURLINFO_TLS_SESSION ?
    (void *)backend->ctx : (void *)backend->handle;
}